

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

lys_module * yang_read_module(ly_ctx *ctx,char *data,uint size,char *revision,int implement)

{
  LY_ERR LVar1;
  int iVar2;
  int iVar3;
  LY_ERR *pLVar4;
  LY_VECODE *pLVar5;
  lys_node *plStack_58;
  int ret;
  lys_node *node;
  unres_schema *unres;
  lys_module *tmp_mod;
  lys_module *module;
  char *pcStack_30;
  int implement_local;
  char *revision_local;
  char *pcStack_20;
  uint size_local;
  char *data_local;
  ly_ctx *ctx_local;
  
  tmp_mod = (lys_module *)0x0;
  node = (lys_node *)0x0;
  plStack_58 = (lys_node *)0x0;
  module._4_4_ = implement;
  pcStack_30 = revision;
  revision_local._4_4_ = size;
  pcStack_20 = data;
  data_local = (char *)ctx;
  node = (lys_node *)calloc(1,0x28);
  if (node == (lys_node *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_module");
  }
  else {
    tmp_mod = (lys_module *)calloc(1,0xb0);
    if (tmp_mod == (lys_module *)0x0) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_module");
    }
    else {
      tmp_mod->ctx = (ly_ctx *)data_local;
      tmp_mod->field_0x40 = tmp_mod->field_0x40 & 0xfe;
      tmp_mod->field_0x40 = tmp_mod->field_0x40 & 0x7f | (module._4_4_ != 0) << 7;
      iVar2 = lyp_check_circmod_add(tmp_mod);
      if (iVar2 == 0) {
        iVar2 = yang_parse_mem(tmp_mod,(lys_submodule *)0x0,(unres_schema *)node,pcStack_20,
                               revision_local._4_4_,&stack0xffffffffffffffa8);
        if (iVar2 == -1) {
          free_yang_common(tmp_mod,plStack_58);
        }
        else {
          if (iVar2 == 1) {
            if (*(int *)&node->ext != 0) {
              __assert_fail("!unres->count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
                            ,0xa42,
                            "struct lys_module *yang_read_module(struct ly_ctx *, const char *, unsigned int, const char *, int)"
                           );
            }
          }
          else {
            iVar3 = yang_check_sub_module(tmp_mod,(unres_schema *)node,plStack_58);
            if ((iVar3 != 0) ||
               ((*(int *)&node->ext != 0 &&
                (iVar3 = resolve_unres_schema(tmp_mod,(unres_schema *)node), iVar3 != 0))))
            goto LAB_00172ec3;
          }
          lyp_sort_revisions(tmp_mod);
          if ((pcStack_30 == (char *)0x0) ||
             ((tmp_mod->rev_size != '\0' &&
              (iVar3 = strcmp(pcStack_30,tmp_mod->rev->date), iVar3 == 0)))) {
            if (iVar2 != 0) {
              unres = (unres_schema *)tmp_mod;
              tmp_mod = ly_ctx_get_module((ly_ctx *)data_local,tmp_mod->name,pcStack_30);
              if (tmp_mod == (lys_module *)0x0) {
                __assert_fail("module",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
                              ,0xa78,
                              "struct lys_module *yang_read_module(struct ly_ctx *, const char *, unsigned int, const char *, int)"
                             );
              }
              lys_free((lys_module *)unres,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
              goto LAB_00172e74;
            }
            iVar2 = lyp_check_include_missing(tmp_mod);
            if (iVar2 == 0) {
              lyp_del_includedup(tmp_mod);
              iVar2 = lyp_rfn_apply_ext(tmp_mod);
              if (((iVar2 == 0) && (iVar2 = lyp_deviation_apply_ext(tmp_mod), iVar2 == 0)) &&
                 (iVar2 = lyp_ctx_add_module(tmp_mod), iVar2 == 0)) {
                if ((tmp_mod->deviation_size != '\0') && (-1 < (char)tmp_mod->field_0x40)) {
                  if ('\x01' < ly_log_level) {
                    ly_log(LY_LLVRB,
                           "Module \"%s\" includes deviations, changing its conformance to \"implement\"."
                           ,tmp_mod->name);
                  }
                  iVar2 = lys_set_implemented(tmp_mod);
                  if (iVar2 != 0) goto LAB_00172ec3;
                }
LAB_00172e74:
                unres_schema_free((lys_module *)0x0,(unres_schema **)&node);
                lyp_check_circmod_pop((ly_ctx *)data_local);
                if ('\x01' < ly_log_level) {
                  ly_log(LY_LLVRB,"Module \"%s\" successfully parsed.",tmp_mod->name);
                }
                return tmp_mod;
              }
            }
          }
          else if ('\x01' < ly_log_level) {
            ly_log(LY_LLVRB,"Module \"%s\" parsed with the wrong revision (\"%s\" instead \"%s\").",
                   tmp_mod->name,tmp_mod->rev,pcStack_30);
          }
        }
      }
    }
  }
LAB_00172ec3:
  unres_schema_free(tmp_mod,(unres_schema **)&node);
  if ((tmp_mod == (lys_module *)0x0) || (tmp_mod->name == (char *)0x0)) {
    free(tmp_mod);
    pLVar5 = ly_vecode_location();
    if (*pLVar5 != LYVE_SUBMODULE) {
      pLVar4 = ly_errno_location();
      if (*pLVar4 != LY_SUCCESS) {
        pLVar4 = ly_errno_location();
        LVar1 = *pLVar4;
        pLVar4 = ly_errno_location();
        *pLVar4 = LVar1;
      }
      ly_log(LY_LLERR,"Module parsing failed.");
    }
  }
  else {
    pLVar4 = ly_errno_location();
    if (*pLVar4 != LY_SUCCESS) {
      pLVar4 = ly_errno_location();
      LVar1 = *pLVar4;
      pLVar4 = ly_errno_location();
      *pLVar4 = LVar1;
    }
    ly_log(LY_LLERR,"Module \"%s\" parsing failed.",tmp_mod->name);
    lyp_check_circmod_pop((ly_ctx *)data_local);
    lyp_del_includedup(tmp_mod);
    lys_sub_module_remove_devs_augs(tmp_mod);
    lys_free(tmp_mod,(_func_void_lys_node_ptr_void_ptr *)0x0,1);
  }
  return (lys_module *)0x0;
}

Assistant:

struct lys_module *
yang_read_module(struct ly_ctx *ctx, const char* data, unsigned int size, const char *revision, int implement)
{

    struct lys_module *module = NULL, *tmp_mod;
    struct unres_schema *unres = NULL;
    struct lys_node *node = NULL;
    int ret;

    unres = calloc(1, sizeof *unres);
    if (!unres) {
        LOGMEM;
        goto error;
    }

    module = calloc(1, sizeof *module);
    if (!module) {
        LOGMEM;
        goto error;
    }

    /* initiale module */
    module->ctx = ctx;
    module->type = 0;
    module->implemented = (implement ? 1 : 0);

    /* add into the list of processed modules */
    if (lyp_check_circmod_add(module)) {
        goto error;
    }

    ret = yang_parse_mem(module, NULL, unres, data, size, &node);
    if (ret == -1) {
        free_yang_common(module, node);
        goto error;
    } else if (ret == 1) {
        assert(!unres->count);
    } else {
        if (yang_check_sub_module(module, unres, node)) {
            goto error;
        }

        if (unres->count && resolve_unres_schema(module, unres)) {
            goto error;
        }
    }

    lyp_sort_revisions(module);

    if (revision) {
        /* check revision of the parsed model */
        if (!module->rev_size || strcmp(revision, module->rev[0].date)) {
            LOGVRB("Module \"%s\" parsed with the wrong revision (\"%s\" instead \"%s\").",
                   module->name, module->rev[0].date, revision);
            goto error;
        }
    }

    /* add into context if not already there */
    if (!ret) {
        /* check correctness of includes */
        if (lyp_check_include_missing(module)) {
            goto error;
        }

        /* remove our submodules from the parsed submodules list */
        lyp_del_includedup(module);


        if (lyp_rfn_apply_ext(module) || lyp_deviation_apply_ext(module)) {
            goto error;
        }

        if (lyp_ctx_add_module(module)) {
            goto error;
        }

        if (module->deviation_size && !module->implemented) {
            LOGVRB("Module \"%s\" includes deviations, changing its conformance to \"implement\".", module->name);
            /* deviations always causes target to be made implemented,
             * but augents and leafrefs not, so we have to apply them now */
            if (lys_set_implemented(module)) {
                goto error;
            }
        }
    } else {
        tmp_mod = module;

        /* get the model from the context */
        module = (struct lys_module *)ly_ctx_get_module(ctx, module->name, revision);
        assert(module);

        /* free what was parsed */
        lys_free(tmp_mod, NULL, 0);
    }

    unres_schema_free(NULL, &unres);
    lyp_check_circmod_pop(ctx);
    LOGVRB("Module \"%s\" successfully parsed.", module->name);
    return module;

error:
    /* cleanup */
    unres_schema_free(module, &unres);
    if (!module || !module->name) {
        free(module);
        if (ly_vecode != LYVE_SUBMODULE) {
            LOGERR(ly_errno, "Module parsing failed.");
        }
        return NULL;
    }

    LOGERR(ly_errno, "Module \"%s\" parsing failed.", module->name);

    lyp_check_circmod_pop(ctx);
    lyp_del_includedup(module);
    lys_sub_module_remove_devs_augs(module);
    lys_free(module, NULL, 1);
    return NULL;
}